

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O0

void __thiscall zmq::dish_t::send_subscriptions(dish_t *this,pipe_t *pipe_)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  pipe_t *in_RSI;
  pipe_t *in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  msg_t msg;
  iterator end;
  iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff88;
  msg_t *in_stack_ffffffffffffff90;
  msg_t local_60;
  _Self local_20;
  _Self local_18;
  pipe_t *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    iVar2 = msg_t::init_join(&local_60);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      in_stack_ffffffffffffff90 = (msg_t *)strerror(*piVar3);
      in_RCX = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffff90,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
              ,0xe5);
      fflush(_stderr);
      zmq_abort((char *)0x2eddd2);
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2eddde);
    std::__cxx11::string::c_str();
    iVar2 = msg_t::set_group(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __buf = extraout_RDX;
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      in_stack_ffffffffffffff88 = strerror(*piVar3);
      in_RCX = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffff88,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
              ,0xe8);
      fflush(_stderr);
      zmq_abort((char *)0x2ede5b);
      __buf = extraout_RDX_00;
    }
    pipe_t::write(local_10,(int)&local_60,__buf,(size_t)in_RCX);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI);
  }
  pipe_t::flush(in_RDI);
  return;
}

Assistant:

void zmq::dish_t::send_subscriptions (pipe_t *pipe_)
{
    for (subscriptions_t::iterator it = _subscriptions.begin (),
                                   end = _subscriptions.end ();
         it != end; ++it) {
        msg_t msg;
        int rc = msg.init_join ();
        errno_assert (rc == 0);

        rc = msg.set_group (it->c_str ());
        errno_assert (rc == 0);

        //  Send it to the pipe.
        pipe_->write (&msg);
    }

    pipe_->flush ();
}